

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallMatrix3x3T.h
# Opt level: O3

void __thiscall CD_Matrix::Matrix3x3T<double>::Set(Matrix3x3T<double> *this,QuaternionT<double> *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar1 = (q->super_Vector4T<double>).m_x;
  dVar3 = (q->super_Vector4T<double>).m_y;
  dVar4 = (q->super_Vector4T<double>).m_z;
  dVar2 = (q->super_Vector4T<double>).m_w;
  dVar5 = dVar2 * dVar2 + dVar4 * dVar4 + dVar1 * dVar1 + dVar3 * dVar3;
  if ((dVar5 == 0.0) && (!NAN(dVar5))) {
    __assert_fail("d != T(0.0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jrl-umi3218[P]sch-core/include/sch/Matrix/SmallMatrix3x3T.h"
                  ,0x13d,
                  "void CD_Matrix::Matrix3x3T<double>::Set(const QuaternionT<T> &) [T = double]");
  }
  dVar5 = 2.0 / dVar5;
  dVar7 = dVar2 * dVar1 * dVar5;
  dVar6 = dVar1 * dVar5 * dVar1;
  dVar8 = dVar5 * dVar3;
  dVar5 = dVar5 * dVar4;
  this->m[0] = 1.0 - (dVar3 * dVar8 + dVar5 * dVar4);
  this->m[1] = dVar1 * dVar8 - dVar2 * dVar5;
  this->m[2] = dVar1 * dVar5 + dVar2 * dVar8;
  this->m[3] = dVar1 * dVar8 + dVar2 * dVar5;
  this->m[4] = 1.0 - (dVar5 * dVar4 + dVar6);
  this->m[5] = dVar3 * dVar5 - dVar7;
  this->m[6] = dVar1 * dVar5 - dVar2 * dVar8;
  this->m[7] = dVar3 * dVar5 + dVar7;
  this->m[8] = 1.0 - (dVar3 * dVar8 + dVar6);
  return;
}

Assistant:

void Set(const QuaternionT<T> & q)
  {
    T q0 = q[0], q1 = q[1], q2 = q[2], q3 = q[3];
    T d = q0 * q0 + q1 * q1 + q2 * q2 + q3 * q3;
    assert(d != T(0.0));
    T s = T(2.0) / d;
    T xs = q0 * s, ys = q1 * s, zs = q2 * s;
    T wx = q3 * xs, wy = q3 * ys, wz = q3 * zs;
    T xx = q0 * xs, xy = q0 * ys, xz = q0 * zs;
    T yy = q1 * ys, yz = q1 * zs, zz = q2 * zs;
    this->m[0] = T(1.0) - (yy + zz), this->m[1] = xy - wz, this->m[2] = xz + wy, this->m[3] = xy + wz,
    this->m[4] = T(1.0) - (xx + zz), this->m[5] = yz - wx, this->m[6] = xz - wy, this->m[7] = yz + wx,
    this->m[8] = T(1.0) - (xx + yy);
  }